

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 * MinVR::VRMatrix4::rotationY(float radians)

{
  VRMatrix4 *in_RDI;
  float in_XMM0_Da;
  float r1c4;
  double dVar1;
  float in_stack_00000010;
  float in_stack_00000018;
  float in_stack_00000020;
  float in_stack_00000028;
  float in_stack_00000030;
  float in_stack_00000038;
  float in_stack_00000040;
  float in_stack_00000048;
  float sinTheta;
  float cosTheta;
  float in_stack_ffffffffffffffe8;
  VRMatrix4 *pVVar2;
  
  pVVar2 = in_RDI;
  dVar1 = std::cos((double)(ulong)(uint)in_XMM0_Da);
  r1c4 = SUB84(dVar1,0);
  dVar1 = std::sin((double)(ulong)(uint)in_XMM0_Da);
  fromRowMajorElements
            ((float)((ulong)pVVar2 >> 0x20),SUB84(pVVar2,0),in_XMM0_Da,r1c4,SUB84(dVar1,0),
             in_stack_ffffffffffffffe8,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048);
  return in_RDI;
}

Assistant:

VRMatrix4 VRMatrix4::rotationY(const float radians) {
  const float cosTheta = cos(radians); 
  const float sinTheta = sin(radians);  
  return VRMatrix4::fromRowMajorElements(cosTheta, 0, sinTheta, 0,
                                         0, 1, 0, 0,
                                         -sinTheta, 0, cosTheta, 0,
                                         0, 0, 0, 1);
}